

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitThis
          (ByteCodeGenerator *this,FuncInfo *funcInfo,RegSlot lhsLocation,RegSlot fromRegister)

{
  bool bVar1;
  BOOL BVar2;
  
  if (((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) {
    bVar1 = FuncInfo::IsGlobalFunction(funcInfo);
    if (!bVar1) {
      BVar2 = FuncInfo::IsLambda(funcInfo);
      if (BVar2 == 0) {
        if (lhsLocation == fromRegister) {
          return;
        }
        Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,lhsLocation,fromRegister);
        return;
      }
    }
  }
  Js::ByteCodeWriter::Reg2Int1
            (&this->m_writer,LdThis,lhsLocation,fromRegister,
             ((this->m_utf8SourceInfo->m_srcInfo).ptr)->moduleID);
  return;
}

Assistant:

void ByteCodeGenerator::EmitThis(FuncInfo *funcInfo, Js::RegSlot lhsLocation, Js::RegSlot fromRegister)
{
    if (funcInfo->byteCodeFunction->GetIsStrictMode() && !funcInfo->IsGlobalFunction() && !funcInfo->IsLambda())
    {
        if (lhsLocation != fromRegister)
        {
            m_writer.Reg2(Js::OpCode::Ld_A, lhsLocation, fromRegister);
        }
    }
    else
    {
        m_writer.Reg2Int1(Js::OpCode::LdThis, lhsLocation, fromRegister, this->GetModuleID());
    }
}